

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O2

void duckdb::
     ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFixedValue<float>,duckdb::LessThan>>
               (Vector *inputs,AggregateInputData *aggr_input,idx_t input_count,Vector *state_vector
               ,idx_t count)

{
  ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,_duckdb::MinMaxFixedValue<float>,_duckdb::LessThan>
  *this;
  ulong uVar1;
  InvalidInputException *pIVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  TYPE_conflict1 val_val;
  TYPE_conflict1 arg_val;
  long local_158;
  UnifiedVectorFormat n_format;
  long local_148;
  long local_140;
  UnifiedVectorFormat arg_format;
  long local_100;
  long local_f8;
  UnifiedVectorFormat val_format;
  long local_b8;
  long local_b0;
  UnifiedVectorFormat state_format;
  long local_70;
  
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&val_format);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&arg_format);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&n_format);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&state_format);
  duckdb::Vector::ToUnifiedFormat((ulong)inputs,(UnifiedVectorFormat *)count);
  duckdb::Vector::ToUnifiedFormat((ulong)(inputs + 0x68),(UnifiedVectorFormat *)count);
  duckdb::Vector::ToUnifiedFormat((ulong)(inputs + 0xd0),(UnifiedVectorFormat *)count);
  duckdb::Vector::ToUnifiedFormat((ulong)state_vector,(UnifiedVectorFormat *)count);
  local_158 = local_70;
  uVar5 = 0;
  do {
    if (count == uVar5) {
      UnifiedVectorFormat::~UnifiedVectorFormat(&state_format);
      UnifiedVectorFormat::~UnifiedVectorFormat(&n_format);
      UnifiedVectorFormat::~UnifiedVectorFormat(&arg_format);
      UnifiedVectorFormat::~UnifiedVectorFormat(&val_format);
      return;
    }
    uVar4 = uVar5;
    if (*_arg_format != 0) {
      uVar4 = (ulong)*(uint *)(*_arg_format + uVar5 * 4);
    }
    uVar3 = uVar5;
    if (*_val_format != 0) {
      uVar3 = (ulong)*(uint *)(*_val_format + uVar5 * 4);
    }
    if (((local_f8 == 0) || ((*(ulong *)(local_f8 + (uVar4 >> 6) * 8) >> (uVar4 & 0x3f) & 1) != 0))
       && ((local_b0 == 0 || ((*(ulong *)(local_b0 + (uVar3 >> 6) * 8) >> (uVar3 & 0x3f) & 1) != 0))
          )) {
      uVar1 = uVar5;
      if (*_state_format != 0) {
        uVar1 = (ulong)*(uint *)(*_state_format + uVar5 * 4);
      }
      this = *(ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,_duckdb::MinMaxFixedValue<float>,_duckdb::LessThan>
               **)(local_158 + uVar1 * 8);
      if (this->is_initialized == false) {
        uVar1 = uVar5;
        if (*_n_format != 0) {
          uVar1 = (ulong)*(uint *)(*_n_format + uVar5 * 4);
        }
        if (local_140 != 0) {
          if ((*(ulong *)(local_140 + (uVar1 >> 6) * 8) >> (uVar1 & 0x3f) & 1) == 0) {
            pIVar2 = (InvalidInputException *)__cxa_allocate_exception(0x10);
            std::__cxx11::string::string
                      ((string *)&arg_val,
                       "Invalid input for arg_min/arg_max: n value cannot be NULL",
                       (allocator *)&val_val);
            duckdb::InvalidInputException::InvalidInputException(pIVar2,(string *)&arg_val);
            __cxa_throw(pIVar2,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
          }
        }
        uVar1 = *(ulong *)(local_148 + uVar1 * 8);
        if ((long)uVar1 < 1) {
          pIVar2 = (InvalidInputException *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string
                    ((string *)&arg_val,"Invalid input for arg_min/arg_max: n value must be > 0",
                     (allocator *)&val_val);
          duckdb::InvalidInputException::InvalidInputException(pIVar2,(string *)&arg_val);
          __cxa_throw(pIVar2,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
        }
        if (999999 < uVar1) {
          pIVar2 = (InvalidInputException *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string
                    ((string *)&arg_val,"Invalid input for arg_min/arg_max: n value must be < %d",
                     (allocator *)&val_val);
          InvalidInputException::InvalidInputException<long>(pIVar2,(string *)&arg_val,1000000);
          __cxa_throw(pIVar2,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
        }
        ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,_duckdb::MinMaxFixedValue<float>,_duckdb::LessThan>
        ::Initialize(this,aggr_input->allocator,uVar1);
      }
      arg_val = *(TYPE_conflict1 *)(local_100 + uVar4 * 4);
      val_val = *(TYPE_conflict1 *)(local_b8 + uVar3 * 4);
      BinaryAggregateHeap<float,_float,_duckdb::LessThan>::Insert
                (&this->heap,aggr_input->allocator,&arg_val,&val_val);
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

static void ArgMinMaxNUpdate(Vector inputs[], AggregateInputData &aggr_input, idx_t input_count, Vector &state_vector,
                             idx_t count) {

	auto &val_vector = inputs[0];
	auto &arg_vector = inputs[1];
	auto &n_vector = inputs[2];

	UnifiedVectorFormat val_format;
	UnifiedVectorFormat arg_format;
	UnifiedVectorFormat n_format;
	UnifiedVectorFormat state_format;

	auto val_extra_state = STATE::VAL_TYPE::CreateExtraState(val_vector, count);
	auto arg_extra_state = STATE::ARG_TYPE::CreateExtraState(arg_vector, count);

	STATE::VAL_TYPE::PrepareData(val_vector, count, val_extra_state, val_format);
	STATE::ARG_TYPE::PrepareData(arg_vector, count, arg_extra_state, arg_format);

	n_vector.ToUnifiedFormat(count, n_format);
	state_vector.ToUnifiedFormat(count, state_format);

	auto states = UnifiedVectorFormat::GetData<STATE *>(state_format);

	for (idx_t i = 0; i < count; i++) {
		const auto arg_idx = arg_format.sel->get_index(i);
		const auto val_idx = val_format.sel->get_index(i);
		if (!arg_format.validity.RowIsValid(arg_idx) || !val_format.validity.RowIsValid(val_idx)) {
			continue;
		}
		const auto state_idx = state_format.sel->get_index(i);
		auto &state = *states[state_idx];

		// Initialize the heap if necessary and add the input to the heap
		if (!state.is_initialized) {
			static constexpr int64_t MAX_N = 1000000;
			const auto nidx = n_format.sel->get_index(i);
			if (!n_format.validity.RowIsValid(nidx)) {
				throw InvalidInputException("Invalid input for arg_min/arg_max: n value cannot be NULL");
			}
			const auto nval = UnifiedVectorFormat::GetData<int64_t>(n_format)[nidx];
			if (nval <= 0) {
				throw InvalidInputException("Invalid input for arg_min/arg_max: n value must be > 0");
			}
			if (nval >= MAX_N) {
				throw InvalidInputException("Invalid input for arg_min/arg_max: n value must be < %d", MAX_N);
			}
			state.Initialize(aggr_input.allocator, UnsafeNumericCast<idx_t>(nval));
		}

		// Now add the input to the heap
		auto arg_val = STATE::ARG_TYPE::Create(arg_format, arg_idx);
		auto val_val = STATE::VAL_TYPE::Create(val_format, val_idx);

		state.heap.Insert(aggr_input.allocator, arg_val, val_val);
	}
}